

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void __thiscall pixels::fillPattern2(pixels *this)

{
  double __x;
  double dVar1;
  double dVar2;
  char cVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  
  iVar13 = this->_h;
  if (0 < iVar13) {
    uVar6 = (ulong)(uint)this->_w;
    uVar12 = 0;
    do {
      iVar11 = (int)uVar12;
      if (0 < (int)uVar6) {
        __x = (double)iVar11 * 0.5;
        uVar14 = 0;
        do {
          iVar13 = (int)uVar14;
          uVar6 = uVar14 & 0xffffffff;
          lVar10 = (long)(this->_stride_x * iVar11 + iVar13);
          (this->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10] =
               iVar13 + (int)((uVar14 & 0xffffffff) / 100) * -100 +
               (iVar11 + (int)(uVar12 / 100) * -100) * 100;
          dVar1 = sin((double)iVar11);
          dVar2 = sin((double)iVar13 * 0.5);
          fVar7 = ABS((float)(dVar2 + dVar1));
          uVar5 = (uint)(float)(dVar2 + dVar1) >> 0x10 & 0x8000;
          if ((uint)fVar7 < 0x38800000) {
            if ((0x33000000 < (uint)fVar7) &&
               (uVar8 = (uint)fVar7 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar7 >> 0x17),
               uVar5 = uVar5 | uVar8 >> (0x7eU - cVar3 & 0x1f),
               0x80000000 < uVar8 << (cVar3 + 0xa2U & 0x1f))) {
              uVar5 = uVar5 + 1;
            }
          }
          else if ((uint)fVar7 < 0x7f800000) {
            if ((uint)fVar7 < 0x477ff000) {
              uVar5 = (int)fVar7 + 0x8000fff + (uint)(((uint)fVar7 >> 0xd & 1) != 0) >> 0xd | uVar5;
            }
            else {
              uVar5 = uVar5 | 0x7c00;
            }
          }
          else {
            uVar5 = uVar5 | 0x7c00;
            if (fVar7 != INFINITY) {
              uVar8 = (uint)fVar7 >> 0xd & 0x3ff;
              uVar5 = uVar5 | uVar8 | (uint)(uVar8 == 0);
            }
          }
          (this->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10] = (float)(uVar5 & 0xffff);
          dVar1 = sin((double)iVar13);
          dVar2 = sin(__x);
          fVar7 = ABS((float)(dVar2 + dVar1));
          uVar4 = (ushort)((uint)(float)(dVar2 + dVar1) >> 0x10) & 0x8000;
          if ((uint)fVar7 < 0x38800000) {
            if ((0x33000000 < (uint)fVar7) &&
               (uVar5 = (uint)fVar7 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar7 >> 0x17),
               uVar4 = uVar4 | (ushort)(uVar5 >> (0x7eU - cVar3 & 0x1f)),
               0x80000000 < uVar5 << (cVar3 + 0xa2U & 0x1f))) {
              uVar4 = uVar4 + 1;
            }
          }
          else if ((uint)fVar7 < 0x7f800000) {
            if ((uint)fVar7 < 0x477ff000) {
              uVar4 = (ushort)((int)fVar7 + 0x8000fff + (uint)(((uint)fVar7 >> 0xd & 1) != 0) >> 0xd
                              ) | uVar4;
            }
            else {
              uVar4 = uVar4 | 0x7c00;
            }
          }
          else {
            uVar4 = uVar4 | 0x7c00;
            if (fVar7 != INFINITY) {
              uVar5 = (uint)fVar7 >> 0xd & 0x3ff;
              uVar4 = uVar4 | (ushort)uVar5 | (ushort)(uVar5 == 0);
            }
          }
          (this->h).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10] = uVar4;
          lVar9 = 0x58;
          do {
            dVar1 = sin((double)(int)uVar6);
            dVar2 = sin(__x);
            fVar7 = ABS((float)(dVar2 + dVar1));
            uVar4 = (ushort)((uint)(float)(dVar2 + dVar1) >> 0x10) & 0x8000;
            if ((uint)fVar7 < 0x38800000) {
              if ((0x33000000 < (uint)fVar7) &&
                 (uVar5 = (uint)fVar7 & 0x7fffff | 0x800000, cVar3 = (char)((uint)fVar7 >> 0x17),
                 uVar4 = uVar4 | (ushort)(uVar5 >> (0x7eU - cVar3 & 0x1f)),
                 0x80000000 < uVar5 << (cVar3 + 0xa2U & 0x1f))) {
                uVar4 = uVar4 + 1;
              }
            }
            else if ((uint)fVar7 < 0x7f800000) {
              if ((uint)fVar7 < 0x477ff000) {
                uVar4 = (ushort)((int)fVar7 + 0x8000fff + (uint)(((uint)fVar7 >> 0xd & 1) != 0) >>
                                0xd) | uVar4;
              }
              else {
                uVar4 = uVar4 | 0x7c00;
              }
            }
            else {
              uVar4 = uVar4 | 0x7c00;
              if (fVar7 != INFINITY) {
                uVar5 = (uint)fVar7 >> 0xd & 0x3ff;
                uVar4 = uVar4 | (ushort)uVar5 | (ushort)(uVar5 == 0);
              }
            }
            *(ushort *)(*(long *)((long)this->rgba + lVar9 + -0x58) + lVar10 * 2) = uVar4;
            uVar6 = (ulong)((int)uVar6 + 1);
            lVar9 = lVar9 + 0x18;
          } while (lVar9 != 0xb8);
          uVar14 = uVar14 + 1;
          uVar6 = (ulong)this->_w;
        } while ((long)uVar14 < (long)uVar6);
        iVar13 = this->_h;
      }
      uVar12 = (ulong)(iVar11 + 1U);
    } while ((int)(iVar11 + 1U) < iVar13);
  }
  return;
}

Assistant:

void fillPattern2 ()
    {
        for (int y = 0; y < _h; ++y)
        {
            for (int x = 0; x < _w; ++x)
            {
                size_t idx = y * _stride_x + x;
                i[idx]     = x % 100 + 100 * (y % 100);
                f[idx] =
                    half (sin (double (y)) + sin (double (x) * 0.5)).bits ();
                h[idx] =
                    half (sin (double (x)) + sin (double (y) * 0.5)).bits ();
                for (int c = 0; c < 4; ++c)
                    rgba[c][idx] =
                        half (sin (double (x + c)) + sin (double (y) * 0.5))
                            .bits ();
            }
        }
    }